

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O0

_Bool evaluate_statement(Scope *scope,Statement *statement,_Bool print_if_not_null)

{
  char *__ptr;
  Value *pVVar1;
  BlockDefinition *block_definition;
  BlockDefinitionStatement *block_definition_statement;
  ImportStatement *import_statement;
  char *s;
  Value *value;
  _Bool print_if_not_null_local;
  Statement *statement_local;
  Scope *scope_local;
  
  switch(statement->statement_type) {
  case StatementTypeExpressionStatement:
    pVVar1 = evaluate_expression(scope,*(Expression **)(statement + 2));
    if ((print_if_not_null) && (pVVar1->value_type != ValueTypeNullValue)) {
      __ptr = convert_to_string(pVVar1);
      printf("%s\n",__ptr);
      free(__ptr);
    }
    free_value(pVVar1);
    scope_local._7_1_ = true;
    break;
  case StatementTypeBlockDefinitionStatement:
    evaluate_block_definition(scope,*(BlockDefinition **)(statement + 2));
    scope_local._7_1_ = true;
    break;
  case StatementTypeReturnStatement:
    pVVar1 = evaluate_expression(scope,*(Expression **)(statement + 2));
    scope_set_return_value(scope,pVVar1);
    scope_local._7_1_ = false;
    break;
  case StatementTypeImportStatement:
    scope_local._7_1_ = true;
    break;
  default:
    scope_local._7_1_ = true;
  }
  return scope_local._7_1_;
}

Assistant:

bool evaluate_statement(Scope *scope, Statement *statement, bool print_if_not_null) {

  switch (statement->statement_type) {
    case StatementTypeExpressionStatement: {
      Value *value = evaluate_expression(scope, ((ExpressionStatement *) statement)->expression);

      if (print_if_not_null && value->value_type != ValueTypeNullValue) {
        char *s = convert_to_string(value);
        printf("%s\n", s);
        free(s);
      }

      free_value(value);

      return true;
    }

    case StatementTypeReturnStatement: {
      scope_set_return_value(scope, evaluate_expression(scope, ((ReturnStatement *) statement)->right_expression));

      return false;
    }

    case StatementTypeImportStatement: {
      ImportStatement *import_statement = (ImportStatement *) statement;

      return true;
    }

    case StatementTypeBlockDefinitionStatement: {
      BlockDefinitionStatement *block_definition_statement = (BlockDefinitionStatement *) statement;

      BlockDefinition *block_definition = block_definition_statement->block_definition;

      evaluate_block_definition(scope, block_definition);

      return true;
    }

    default: {
      return true;
    }
  }
}